

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall
cmStateDirectory::StoreProperty<cmValue>
          (cmStateDirectory *this,string *prop,cmValue value,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  string *psVar2;
  PointerType pBVar3;
  cmListFileBacktrace local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1e8;
  cmListFileBacktrace local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_188;
  cmListFileBacktrace local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_128;
  cmListFileBacktrace local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_c8;
  cmListFileBacktrace local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_58;
  cmListFileBacktrace *local_28;
  cmListFileBacktrace *lfbt_local;
  string *prop_local;
  cmStateDirectory *this_local;
  cmValue value_local;
  
  local_28 = lfbt;
  lfbt_local = (cmListFileBacktrace *)prop;
  prop_local = (string *)this;
  this_local = (cmStateDirectory *)value.Value;
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
    if (bVar1) {
      psVar2 = cmValue::operator_cast_to_string_((cmValue *)&this_local);
      std::__cxx11::string::string((string *)&local_78,(string *)psVar2);
      cmListFileBacktrace::cmListFileBacktrace(&local_88,local_28);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_58,&local_78,&local_88);
      SetIncludeDirectories(this,&local_58);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_58);
      cmListFileBacktrace::~cmListFileBacktrace(&local_88);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      ClearIncludeDirectories(this);
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            lfbt_local,"COMPILE_OPTIONS");
    if (bVar1) {
      bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
      if (bVar1) {
        psVar2 = cmValue::operator_cast_to_string_((cmValue *)&this_local);
        std::__cxx11::string::string((string *)&local_e8,(string *)psVar2);
        cmListFileBacktrace::cmListFileBacktrace(&local_f8,local_28);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_c8,&local_e8,&local_f8);
        SetCompileOptions(this,&local_c8);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_c8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_f8);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      else {
        ClearCompileOptions(this);
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              lfbt_local,"COMPILE_DEFINITIONS");
      if (bVar1) {
        bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
        if (bVar1) {
          psVar2 = cmValue::operator_cast_to_string_((cmValue *)&this_local);
          std::__cxx11::string::string((string *)&local_148,(string *)psVar2);
          cmListFileBacktrace::cmListFileBacktrace(&local_158,local_28);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_128,&local_148,&local_158);
          SetCompileDefinitions(this,&local_128);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_128);
          cmListFileBacktrace::~cmListFileBacktrace(&local_158);
          std::__cxx11::string::~string((string *)&local_148);
        }
        else {
          ClearCompileDefinitions(this);
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )lfbt_local,"LINK_OPTIONS");
        if (bVar1) {
          bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
          if (bVar1) {
            psVar2 = cmValue::operator_cast_to_string_((cmValue *)&this_local);
            std::__cxx11::string::string((string *)&local_1a8,(string *)psVar2);
            cmListFileBacktrace::cmListFileBacktrace(&local_1b8,local_28);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                      (&local_188,&local_1a8,&local_1b8);
            SetLinkOptions(this,&local_188);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT(&local_188);
            cmListFileBacktrace::~cmListFileBacktrace(&local_1b8);
            std::__cxx11::string::~string((string *)&local_1a8);
          }
          else {
            ClearLinkOptions(this);
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)lfbt_local,"LINK_DIRECTORIES");
          if (bVar1) {
            bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
            if (bVar1) {
              psVar2 = cmValue::operator_cast_to_string_((cmValue *)&this_local);
              std::__cxx11::string::string((string *)&local_208,(string *)psVar2);
              cmListFileBacktrace::cmListFileBacktrace(&local_218,local_28);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT(&local_1e8,&local_208,&local_218);
              SetLinkDirectories(this,&local_1e8);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT(&local_1e8);
              cmListFileBacktrace::~cmListFileBacktrace(&local_218);
              std::__cxx11::string::~string((string *)&local_208);
            }
            else {
              ClearLinkDirectories(this);
            }
          }
          else {
            pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmPropertyMap::SetProperty(&pBVar3->Properties,(string *)lfbt_local,(cmValue)this_local)
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmStateDirectory::StoreProperty(const std::string& prop, ValueType value,
                                     cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    if (!value) {
      this->ClearIncludeDirectories();
      return;
    }
    this->SetIncludeDirectories(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    if (!value) {
      this->ClearCompileOptions();
      return;
    }
    this->SetCompileOptions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    if (!value) {
      this->ClearCompileDefinitions();
      return;
    }
    this->SetCompileDefinitions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_OPTIONS") {
    if (!value) {
      this->ClearLinkOptions();
      return;
    }
    this->SetLinkOptions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_DIRECTORIES") {
    if (!value) {
      this->ClearLinkDirectories();
      return;
    }
    this->SetLinkDirectories(BT<std::string>(value, lfbt));
    return;
  }

  this->DirectoryState->Properties.SetProperty(prop, value);
}